

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O2

Vector3 * operator+(Vector3 *__return_storage_ptr__,Vector3 *u,Vector3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = Vector3::getX(u);
  dVar2 = Vector3::getX(v);
  dVar3 = Vector3::getY(u);
  dVar4 = Vector3::getY(v);
  dVar5 = Vector3::getZ(u);
  dVar6 = Vector3::getZ(v);
  Vector3::Vector3(__return_storage_ptr__,dVar2 + dVar1,dVar3 + dVar4,dVar5 + dVar6);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 operator+(const Vector3 &u, const Vector3 &v) {
    return {u.getX() + v.getX(), u.getY() + v.getY(), u.getZ() + v.getZ()};
}